

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
GdlSubstitutionItem::LhsPrettyPrint
          (GdlSubstitutionItem *this,GrcManager *param_2,GdlRule *param_3,int param_4,
          ostream *strmOut,bool param_6)

{
  ostream *in_R8;
  byte in_R9B;
  GrcSymbolTableEntry *in_stack_00000028;
  string local_50 [39];
  byte local_29;
  ostream *local_28;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_(in_stack_00000028);
  std::operator<<(in_R8,local_50);
  std::__cxx11::string::~string(local_50);
  std::operator<<(local_28,"  ");
  return;
}

Assistant:

void GdlSubstitutionItem::LhsPrettyPrint(GrcManager * /*pcman*/, GdlRule * /*prule*/, int /*irit*/,
	std::ostream & strmOut, bool /*fXml*/)
{
	strmOut << m_psymInput->FullAbbrev();
	strmOut << "  ";
}